

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::EmitTest::init(EmitTest *this,EVP_PKEY_CTX *ctx)

{
  int endCountA;
  int emitCountB;
  int endCountB;
  GeometryShaderOutputType outputType;
  int iVar1;
  VertexEmitterShader *this_00;
  RenderContext *pRVar2;
  EVP_PKEY_CTX *ctx_00;
  int local_14;
  EmitTest *local_10;
  EmitTest *this_local;
  
  local_10 = this;
  this_00 = (VertexEmitterShader *)operator_new(0x168);
  pRVar2 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_14 = (*pRVar2->_vptr_RenderContext[2])();
  iVar1 = this->m_emitCountA;
  endCountA = this->m_endCountA;
  emitCountB = this->m_emitCountB;
  endCountB = this->m_endCountB;
  outputType = sglr::rr_util::mapGLGeometryShaderOutputType(this->m_outputType);
  ctx_00 = (EVP_PKEY_CTX *)&local_14;
  VertexEmitterShader::VertexEmitterShader
            (this_00,(ContextType *)ctx_00,iVar1,endCountA,emitCountB,endCountB,outputType);
  this->m_program = this_00;
  iVar1 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar1;
}

Assistant:

void EmitTest::init(void)
{
	m_program = new VertexEmitterShader(m_context.getRenderContext().getType(), m_emitCountA, m_endCountA, m_emitCountB, m_endCountB, sglr::rr_util::mapGLGeometryShaderOutputType(m_outputType));

	GeometryShaderRenderTest::init();
}